

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void load_reg_var(DisasContext_conflict1 *s,TCGv_i32 var,int reg)

{
  TCGContext_conflict1 *tcg_ctx;
  
  tcg_ctx = s->uc->tcg_ctx;
  if (reg == 0xf) {
    tcg_gen_movi_i32(tcg_ctx,var,(int)s->pc_curr + (uint)(s->thumb == 0) * 4 + 4);
    return;
  }
  tcg_gen_mov_i32(tcg_ctx,var,tcg_ctx->cpu_R[reg]);
  return;
}

Assistant:

static void load_reg_var(DisasContext *s, TCGv_i32 var, int reg)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    if (reg == 15) {
        tcg_gen_movi_i32(tcg_ctx, var, read_pc(s));
    } else {
        tcg_gen_mov_i32(tcg_ctx, var, tcg_ctx->cpu_R[reg]);
    }
}